

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cpp
# Opt level: O3

BrotliEncoderPreparedDictionary *
duckdb_brotli::BrotliEncoderPrepareDictionary
          (BrotliSharedDictionaryType type,size_t size,uint8_t *data,int quality,
          brotli_alloc_func alloc_func,brotli_free_func free_func,void *opaque)

{
  ManagedDictionary *dictionary;
  PreparedDictionary *pPVar1;
  
  if ((type == BROTLI_SHARED_DICTIONARY_RAW) &&
     (dictionary = BrotliCreateManagedDictionary(alloc_func,free_func,opaque),
     dictionary != (ManagedDictionary *)0x0)) {
    pPVar1 = CreatePreparedDictionary(&dictionary->memory_manager_,data,size);
    dictionary->dictionary = &pPVar1->magic;
    if (pPVar1 != (PreparedDictionary *)0x0) {
      return (BrotliEncoderPreparedDictionary *)dictionary;
    }
    BrotliDestroyManagedDictionary(dictionary);
  }
  return (BrotliEncoderPreparedDictionary *)0x0;
}

Assistant:

BrotliEncoderPreparedDictionary*  duckdb_brotli::BrotliEncoderPrepareDictionary(
    BrotliSharedDictionaryType type, size_t size,
    const uint8_t data[BROTLI_ARRAY_PARAM(size)], int quality,
    brotli_alloc_func alloc_func, brotli_free_func free_func, void* opaque) {
  ManagedDictionary* managed_dictionary = NULL;
  BROTLI_BOOL type_is_known = BROTLI_FALSE;
  type_is_known |= (type == BROTLI_SHARED_DICTIONARY_RAW);
#if defined(BROTLI_EXPERIMENTAL)
  type_is_known |= (type == BROTLI_SHARED_DICTIONARY_SERIALIZED);
#endif  /* BROTLI_EXPERIMENTAL */
  if (!type_is_known) {
    return NULL;
  }
  managed_dictionary =
      BrotliCreateManagedDictionary(alloc_func, free_func, opaque);
  if (managed_dictionary == NULL) {
    return NULL;
  }
  if (type == BROTLI_SHARED_DICTIONARY_RAW) {
    managed_dictionary->dictionary = (uint32_t*)CreatePreparedDictionary(
        &managed_dictionary->memory_manager_, data, size);
  }
#if defined(BROTLI_EXPERIMENTAL)
  if (type == BROTLI_SHARED_DICTIONARY_SERIALIZED) {
    SharedEncoderDictionary* dict = (SharedEncoderDictionary*)BrotliAllocate(
        &managed_dictionary->memory_manager_, sizeof(SharedEncoderDictionary));
    managed_dictionary->dictionary = (uint32_t*)dict;
    if (dict != NULL) {
      BROTLI_BOOL ok = BrotliInitCustomSharedEncoderDictionary(
          &managed_dictionary->memory_manager_, data, size, quality, dict);
      if (!ok) {
        BrotliFree(&managed_dictionary->memory_manager_, dict);
        managed_dictionary->dictionary = NULL;
      }
    }
  }
#else  /* BROTLI_EXPERIMENTAL */
  (void)quality;
#endif  /* BROTLI_EXPERIMENTAL */
  if (managed_dictionary->dictionary == NULL) {
    BrotliDestroyManagedDictionary(managed_dictionary);
    return NULL;
  }
  return (BrotliEncoderPreparedDictionary*)managed_dictionary;
}